

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O2

int PAL_vsscanf(LPCSTR Buffer,LPCSTR Format,__va_list_tag *ap)

{
  byte bVar1;
  undefined8 uVar2;
  LPWSTR lpWideCharStr;
  FILE *__stream;
  byte bVar3;
  int iVar4;
  uint uVar5;
  errno_t eVar6;
  DWORD DVar7;
  size_t sVar8;
  char *__nptr;
  undefined8 *puVar9;
  int iVar10;
  byte *pbVar11;
  byte *pbVar12;
  uint uVar13;
  ulong uVar14;
  undefined4 uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  byte *pbVar19;
  byte *pbVar20;
  byte *pbVar21;
  long in_FS_OFFSET;
  bool bVar22;
  int local_480;
  int local_464;
  __va_list_tag *p_Stack_460;
  int n;
  byte *local_458;
  undefined8 local_450;
  byte *local_448;
  undefined4 local_440;
  byte local_439;
  byte local_438;
  byte local_437;
  byte local_436 [6];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  uVar5 = 0xffffffff;
  uVar13 = 0;
  pbVar12 = (byte *)Buffer;
  p_Stack_460 = ap;
LAB_00117890:
  do {
    uVar16 = (ulong)uVar13;
LAB_00117899:
    do {
      while( true ) {
        pbVar11 = pbVar12;
        if (*Format == 0) goto LAB_001185dd;
        if ((*pbVar11 == 0) && ((int)uVar16 == 0)) goto LAB_001185d7;
        iVar4 = isspace((uint)(byte)*Format);
        if (iVar4 == 0) break;
        pbVar12 = pbVar11 + -1;
        do {
          pbVar11 = pbVar12 + 1;
          pbVar12 = pbVar12 + 1;
          iVar4 = isspace((uint)*pbVar11);
        } while (iVar4 != 0);
        Format = (LPCSTR)((byte *)Format + 1);
      }
      if (*Format != 0x25) goto LAB_001183f3;
      pbVar12 = (byte *)Format + 1;
      local_438 = 0x25;
      sVar8 = strlen((char *)pbVar12);
      __nptr = (char *)PAL_malloc(sVar8 + 1);
      if (__nptr == (char *)0x0) {
        DVar7 = 8;
        uVar5 = 0xffffffff;
joined_r0x00117b15:
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00118606;
        SetLastError(DVar7);
        Format = (LPCSTR)pbVar12;
        goto LAB_001183f3;
      }
      local_439 = *pbVar12;
      pbVar19 = &local_437;
      bVar3 = local_439;
      if (local_439 == 0x2a) {
        local_437 = 0x2a;
        bVar3 = ((byte *)Format)[2];
        pbVar12 = (byte *)Format + 2;
        pbVar19 = local_436;
      }
      local_458 = pbVar12;
      iVar4 = isdigit((uint)bVar3);
      pbVar12 = local_458;
      if (iVar4 == 0) {
        uVar14 = 0xffffffff;
        local_448 = pbVar19;
      }
      else {
        lVar18 = 0;
        local_450 = uVar16;
        while( true ) {
          pbVar20 = pbVar19 + lVar18;
          iVar4 = isdigit((uint)pbVar12[lVar18]);
          if (iVar4 == 0) break;
          bVar3 = pbVar12[lVar18];
          __nptr[lVar18] = bVar3;
          if ((pbVar20 < &local_438) || (TempBuff + 0x3f8 <= pbVar20)) {
            SetLastError(0x7a);
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_00118606;
            uVar5 = 0xffffffff;
            Format = (LPCSTR)(local_458 + lVar18);
            uVar16 = local_450;
            goto LAB_001183f3;
          }
          *pbVar20 = bVar3;
          lVar18 = lVar18 + 1;
        }
        __nptr[lVar18] = '\0';
        uVar5 = atoi(__nptr);
        pbVar12 = pbVar12 + lVar18;
        uVar16 = local_450;
        if ((int)uVar5 < 0) {
          DVar7 = 0x54f;
          uVar5 = 0xffffffff;
          goto joined_r0x00117b15;
        }
        uVar14 = (ulong)uVar5;
        local_448 = pbVar20;
      }
      pbVar20 = local_448;
      bVar3 = *pbVar12;
      pbVar19 = (byte *)(TempBuff + 0x3f8);
      if (bVar3 != 0x77) {
        if (bVar3 == 0x4c) {
          pbVar12 = pbVar12 + 1;
LAB_00117b30:
          uVar13 = 0xffffffff;
          pbVar21 = pbVar12;
          goto LAB_00117b34;
        }
        if (bVar3 == 0x68) {
          uVar13 = 1;
          pbVar21 = pbVar12 + 1;
          goto LAB_00117b34;
        }
        if (bVar3 == 0x6c) goto LAB_00117acb;
        if (bVar3 != 0x70) {
          if (bVar3 == 0x49) {
            if (pbVar12[1] != 0x36) goto LAB_00117b30;
            uVar13 = (uint)(pbVar12[2] == 0x34) * 4 - 1;
            pbVar21 = pbVar12 + (ulong)(pbVar12[2] == 0x34) * 3;
            goto LAB_00117b34;
          }
          uVar13 = 0xffffffff;
          goto LAB_00117b37;
        }
LAB_00117bed:
        if (&local_438 <= local_448 && local_448 < pbVar19) {
          local_450 = uVar14;
          eVar6 = strcpy_s((char *)local_448,(long)pbVar19 - (long)local_448,"ll");
          if (eVar6 != 0) {
            DVar7 = 0x7a;
            uVar5 = 3;
            goto joined_r0x00117b15;
          }
          sVar8 = strlen("ll");
          uVar13 = 3;
          uVar14 = local_450;
          pbVar20 = pbVar20 + sVar8;
LAB_00117f3d:
          Format = (LPCSTR)pbVar12;
          if (&local_438 <= pbVar20 && pbVar20 < TempBuff + 0x3f8) {
            bVar3 = *pbVar12;
            pbVar12 = pbVar12 + 1;
            *pbVar20 = bVar3;
            pbVar20 = pbVar20 + 1;
            uVar15 = 0;
            local_440 = 0;
            bVar3 = 0;
            bVar22 = false;
            uVar5 = 3;
            goto LAB_00117f6d;
          }
LAB_00117f7b:
          SetLastError(0x7a);
          bVar22 = PAL_InitializeChakraCoreCalled == false;
          uVar5 = 3;
LAB_001183eb:
          if (bVar22) goto LAB_00118606;
          goto LAB_001183f3;
        }
        SetLastError(0x7a);
        uVar5 = 3;
        goto joined_r0x00117cc5;
      }
LAB_00117acb:
      pbVar21 = pbVar12 + 1;
      uVar13 = -(uint)((pbVar12[1] + 0x9d & 0xef) != 0) | 2;
      if (pbVar12[1] == 0x6c) {
        uVar13 = 3;
        pbVar21 = pbVar12 + 2;
      }
LAB_00117b34:
      bVar3 = *pbVar21;
      pbVar12 = pbVar21;
LAB_00117b37:
      uVar5 = (uint)bVar3;
      Format = (LPCSTR)pbVar12;
      switch(uVar5) {
      case 0x58:
      case 100:
      case 0x69:
      case 0x6f:
      case 0x70:
      case 0x75:
      case 0x78:
        if (uVar13 == 3) goto LAB_00117bed;
        if (uVar13 == 2) {
          if (&local_438 <= local_448 && local_448 < pbVar19) {
            *local_448 = 0x6c;
            uVar13 = 2;
LAB_00117d31:
            pbVar20 = local_448 + 1;
            goto LAB_00117f3d;
          }
        }
        else {
          if (uVar13 != 1) goto LAB_00117f3d;
          if (&local_438 <= local_448 && local_448 < pbVar19) {
            *local_448 = 0x68;
            uVar13 = 1;
            goto LAB_00117d31;
          }
        }
        goto LAB_00117f7b;
      case 0x59:
      case 0x5a:
      case 0x5c:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x61:
      case 0x62:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x76:
      case 0x77:
switchD_00117b53_caseD_59:
        uVar5 = 0xffffffff;
        goto LAB_00117fb3;
      case 0x5b:
        if (local_448 < &local_438 || pbVar19 <= local_448) {
LAB_001183d4:
          SetLastError(0x7a);
        }
        else {
          pbVar20 = local_448 + 1;
          *local_448 = 0x5b;
          Format = (LPCSTR)(pbVar12 + 1);
          bVar3 = pbVar12[1];
          if (bVar3 != 0x5e) {
LAB_001181aa:
            pbVar12 = (byte *)Format;
            if (bVar3 == 0x5d) {
              Format = (LPCSTR)pbVar12;
              if (pbVar20 < &local_438 || pbVar19 <= pbVar20) goto LAB_001183d4;
              *pbVar20 = 0x5d;
              pbVar20 = pbVar20 + 1;
              bVar3 = pbVar12[1];
              pbVar12 = pbVar12 + 1;
            }
            if (bVar3 != 0x2d) {
LAB_0011820f:
              do {
                bVar3 = *pbVar12;
                Format = (LPCSTR)pbVar12;
                if (bVar3 != 0x2d) {
                  if (bVar3 != 0) {
                    if (bVar3 != 0x5d) {
                      if ((&local_438 <= pbVar20) && (pbVar20 < pbVar19)) {
                        *pbVar20 = bVar3;
                        goto LAB_0011826d;
                      }
                      goto LAB_001183d4;
                    }
                    if (pbVar20 < &local_438 || pbVar19 <= pbVar20) goto LAB_001183d4;
                    *pbVar20 = 0x5d;
                    pbVar20 = pbVar20 + 1;
                    pbVar12 = pbVar12 + 1;
                  }
                  uVar15 = 0;
                  local_440 = 0;
                  bVar22 = false;
                  uVar5 = 6;
                  local_450 = (ulong)local_450._4_4_ << 0x20;
                  bVar3 = 0;
                  goto LAB_00117fbc;
                }
                bVar3 = pbVar12[1];
                if (bVar3 == 0x5d) {
                  if ((pbVar20 < &local_438) || (pbVar19 <= pbVar20)) goto LAB_001183d4;
                  *pbVar20 = 0x2d;
LAB_0011826d:
                  pbVar20 = pbVar20 + 1;
                  lVar18 = 1;
                }
                else {
                  bVar1 = pbVar12[-1];
                  if (bVar3 < bVar1) {
                    pbVar21 = pbVar20 + -1;
                    if ((pbVar21 < &local_438) || (pbVar19 <= pbVar21)) goto LAB_001183d4;
                    *pbVar21 = bVar3;
                    bVar3 = bVar1;
                  }
                  if ((pbVar20 < &local_438) || (pbVar19 <= pbVar20)) goto LAB_001183d4;
                  *pbVar20 = 0x2d;
                  if ((pbVar20 + 1 < &local_438) || (pbVar19 <= pbVar20 + 1)) goto LAB_001183d4;
                  pbVar20[1] = bVar3;
                  pbVar20 = pbVar20 + 2;
                  lVar18 = 2;
                }
                pbVar12 = pbVar12 + lVar18;
              } while( true );
            }
            Format = (LPCSTR)pbVar12;
            if (&local_438 <= pbVar20 && pbVar20 < pbVar19) {
              *pbVar20 = 0x2d;
              pbVar20 = pbVar20 + 1;
              pbVar12 = pbVar12 + 1;
              goto LAB_0011820f;
            }
            goto LAB_001183d4;
          }
          if (&local_438 <= pbVar20 && pbVar20 < pbVar19) {
            local_448[1] = 0x5e;
            pbVar20 = local_448 + 2;
            bVar3 = pbVar12[2];
            Format = (LPCSTR)(pbVar12 + 2);
            goto LAB_001181aa;
          }
          SetLastError(0x7a);
        }
        bVar22 = PAL_InitializeChakraCoreCalled == false;
        uVar5 = 0xffffffff;
        goto LAB_001183eb;
      case 99:
switchD_00117b53_caseD_63:
        if (uVar13 == 1) {
          uVar13 = 1;
LAB_00117ecf:
          if (&local_438 <= pbVar20 && pbVar20 < pbVar19) {
            *pbVar20 = 99;
            pbVar20 = pbVar20 + 1;
            pbVar12 = pbVar12 + 1;
            local_440 = (undefined4)CONCAT71((int7)((ulong)&local_438 >> 8),1);
            uVar15 = 0;
            bVar3 = 1;
            bVar22 = false;
            uVar5 = 1;
            goto LAB_00117f6d;
          }
        }
        else {
          if ((bVar3 != 0x43) && (uVar13 != 2)) goto LAB_00117ecf;
          if (&local_438 <= local_448 && local_448 < pbVar19) {
            *local_448 = 0x6c;
            pbVar20 = local_448 + 1;
            uVar13 = 2;
            goto LAB_00117ecf;
          }
        }
        SetLastError(0x7a);
        bVar22 = PAL_InitializeChakraCoreCalled == false;
        uVar5 = 1;
        goto LAB_001183eb;
      case 0x65:
      case 0x66:
      case 0x67:
switchD_00117b53_caseD_65:
        if (local_448 < &local_438 || TempBuff + 0x3f8 <= local_448) {
          SetLastError(0x7a);
          bVar22 = PAL_InitializeChakraCoreCalled == false;
          uVar5 = 5;
          goto LAB_001183eb;
        }
        pbVar12 = pbVar12 + 1;
        iVar4 = tolower(uVar5);
        *local_448 = (byte)iVar4;
        pbVar20 = local_448 + 1;
        uVar15 = 0;
        local_440 = 0;
        bVar3 = 0;
        bVar22 = false;
        uVar5 = 5;
        local_450 = local_450 & 0xffffffff00000000;
        break;
      case 0x6e:
        if (uVar13 == 1) {
          if (local_448 < &local_438 || pbVar19 <= local_448) goto LAB_001183d4;
          *local_448 = 0x68;
          pbVar20 = local_448 + 1;
        }
        if (pbVar20 < &local_438 || pbVar19 <= pbVar20) goto LAB_001183d4;
        bVar3 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        *pbVar20 = bVar3;
        pbVar20 = pbVar20 + 1;
        uVar15 = 1;
        local_440 = 0;
        bVar3 = 0;
        bVar22 = false;
        uVar5 = 4;
LAB_00117f6d:
        local_450 = local_450 & 0xffffffff00000000;
        break;
      case 0x73:
switchD_00117b53_caseD_73:
        if (uVar13 == 1) {
          uVar13 = 1;
LAB_00117e47:
          if (&local_438 <= pbVar20 && pbVar20 < pbVar19) {
            *pbVar20 = 0x73;
            pbVar20 = pbVar20 + 1;
            pbVar12 = pbVar12 + 1;
            local_440 = (undefined4)CONCAT71((int7)((ulong)&local_438 >> 8),1);
            uVar15 = 0;
            bVar3 = 0;
            bVar22 = true;
            uVar5 = 2;
            goto LAB_00117f6d;
          }
        }
        else {
          if ((bVar3 != 0x53) && (uVar13 != 2)) goto LAB_00117e47;
          if (&local_438 <= local_448 && local_448 < pbVar19) {
            *local_448 = 0x6c;
            pbVar20 = local_448 + 1;
            uVar13 = 2;
            goto LAB_00117e47;
          }
        }
        SetLastError(0x7a);
        bVar22 = PAL_InitializeChakraCoreCalled == false;
        uVar5 = 2;
        goto LAB_001183eb;
      default:
        if (uVar5 != 0x20) {
          if (uVar5 == 0x53) goto switchD_00117b53_caseD_73;
          if ((uVar5 == 0x45) || (uVar5 == 0x47)) goto switchD_00117b53_caseD_65;
          if (uVar5 == 0x43) goto switchD_00117b53_caseD_63;
          goto switchD_00117b53_caseD_59;
        }
        uVar5 = 7;
LAB_00117fb3:
        local_440 = 0;
        local_450 = CONCAT44(local_450._4_4_,1);
        bVar22 = false;
        uVar15 = 0;
        bVar3 = 0;
      }
LAB_00117fbc:
      pbVar19 = (byte *)(TempBuff + 0x3f8);
      local_458 = pbVar12;
      if ((pbVar20 < &local_438 || pbVar19 <= pbVar20) ||
         (*pbVar20 = 0x25, pbVar20 + 1 < &local_438 || pbVar19 <= pbVar20 + 1)) {
        SetLastError(0x7a);
        pbVar12 = local_458;
joined_r0x00117cc5:
        Format = (LPCSTR)pbVar12;
        if (PAL_InitializeChakraCoreCalled == false) {
LAB_00118606:
          abort();
        }
LAB_001183f3:
        if ((*Format != *pbVar11) || (uVar5 == 7)) goto LAB_001185dd;
        Format = (LPCSTR)((byte *)Format + 1);
        pbVar12 = pbVar11 + 1;
        goto LAB_00117899;
      }
      pbVar20[1] = 0x6e;
      pbVar20 = pbVar20 + 2;
      if (pbVar20 < &local_438 || pbVar19 <= pbVar20) {
        SetLastError(0x7a);
        pbVar12 = local_458;
        goto joined_r0x00117cc5;
      }
      local_448 = (byte *)CONCAT44(local_448._4_4_,uVar15);
      uVar17 = (uint)uVar14;
      *pbVar20 = 0;
      PAL_free(__nptr);
      Format = (LPCSTR)local_458;
      if ((char)local_450 != '\0') goto LAB_001183f3;
      local_480 = (int)Buffer;
      if (uVar13 != 2) {
        if ((char)local_448 == '\0') {
LAB_00118418:
          if (local_439 == 0x2a) {
            iVar4 = sscanf_s((char *)pbVar11,(char *)&local_438,&local_464);
          }
          else {
            uVar13 = p_Stack_460->gp_offset;
            if ((ulong)uVar13 < 0x29) {
              puVar9 = (undefined8 *)((ulong)uVar13 + (long)p_Stack_460->reg_save_area);
              p_Stack_460->gp_offset = uVar13 + 8;
            }
            else {
              puVar9 = (undefined8 *)p_Stack_460->overflow_arg_area;
              p_Stack_460->overflow_arg_area = puVar9 + 1;
            }
            uVar2 = *puVar9;
            if ((uVar5 & 0xfffffffb) == 2) {
              if ((int)uVar17 < 1) {
                sVar8 = strlen(Buffer);
                uVar17 = (uint)sVar8;
              }
              uVar13 = uVar17 + 1;
              if (uVar17 + 1 != 0) {
LAB_001184dd:
                iVar4 = sscanf_s((char *)pbVar11,(char *)&local_438,uVar2,(ulong)uVar13,&local_464);
                goto LAB_00118518;
              }
            }
            else if (bVar3 != 0) {
              uVar13 = uVar17;
              if ((int)uVar17 < 2) {
                uVar13 = 1;
              }
              goto LAB_001184dd;
            }
            iVar4 = sscanf_s((char *)pbVar11,(char *)&local_438,uVar2,&local_464);
          }
LAB_00118518:
          uVar13 = iVar4 + (int)uVar16;
          pbVar12 = pbVar11 + local_464;
          Format = (LPCSTR)local_458;
          if (0 < iVar4) goto LAB_00117890;
          goto LAB_001185dd;
        }
        if (uVar13 != 1) goto LAB_001182f5;
        uVar5 = p_Stack_460->gp_offset;
        if ((ulong)uVar5 < 0x29) {
          puVar9 = (undefined8 *)((ulong)uVar5 + (long)p_Stack_460->reg_save_area);
          p_Stack_460->gp_offset = uVar5 + 8;
        }
        else {
          puVar9 = (undefined8 *)p_Stack_460->overflow_arg_area;
          p_Stack_460->overflow_arg_area = puVar9 + 1;
        }
        *(short *)*puVar9 = (short)pbVar11 - (short)Buffer;
LAB_0011837f:
        uVar5 = 4;
        pbVar12 = pbVar11;
        goto LAB_00117899;
      }
      if ((char)local_440 == '\0') {
        if ((char)local_448 == '\0') goto LAB_00118418;
LAB_001182f5:
        uVar5 = p_Stack_460->gp_offset;
        if ((ulong)uVar5 < 0x29) {
          puVar9 = (undefined8 *)((ulong)uVar5 + (long)p_Stack_460->reg_save_area);
          p_Stack_460->gp_offset = uVar5 + 8;
        }
        else {
          puVar9 = (undefined8 *)p_Stack_460->overflow_arg_area;
          p_Stack_460->overflow_arg_area = puVar9 + 1;
        }
        *(int *)*puVar9 = (int)pbVar11 - local_480;
        goto LAB_0011837f;
      }
      bVar3 = uVar17 == 0xffffffff & bVar3;
      if (bVar3 != 0) {
        uVar14 = 1;
      }
      local_450 = uVar14 & 0xffffffff;
      uVar13 = (uint)bVar3;
      while( true ) {
        if (pbVar11[(int)uVar13] == 0) break;
        iVar10 = (int)local_450;
        iVar4 = isspace((uint)pbVar11[(int)uVar13]);
        if ((iVar4 != 0) || (iVar10 != -1 && (int)local_450 <= (int)uVar13)) break;
        uVar13 = uVar13 + 1;
      }
      pbVar12 = pbVar11 + (int)uVar13;
      Format = (LPCSTR)local_458;
    } while (local_439 == 0x2a);
    uVar17 = p_Stack_460->gp_offset;
    if ((ulong)uVar17 < 0x29) {
      puVar9 = (undefined8 *)((ulong)uVar17 + (long)p_Stack_460->reg_save_area);
      p_Stack_460->gp_offset = uVar17 + 8;
    }
    else {
      puVar9 = (undefined8 *)p_Stack_460->overflow_arg_area;
      p_Stack_460->overflow_arg_area = puVar9 + 1;
    }
    lpWideCharStr = (LPWSTR)*puVar9;
    iVar4 = MultiByteToWideChar(0,0,(LPCSTR)pbVar11,uVar13,lpWideCharStr,uVar13);
    if (iVar4 == 0) {
      fprintf(_stderr,"] %s %s:%d","PAL_vsscanf",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
              ,0x484);
      __stream = _stderr;
      DVar7 = GetLastError();
      fprintf(__stream,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar7);
LAB_001185d7:
      uVar16 = 0xffffffff;
LAB_001185dd:
      if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
        __stack_chk_fail();
      }
      return (int)uVar16;
    }
    if (bVar22) {
      lpWideCharStr[iVar4] = L'\0';
    }
    uVar13 = (int)uVar16 + 1;
    Format = (LPCSTR)local_458;
  } while( true );
}

Assistant:

__attribute__((no_instrument_function))
int PAL_vsscanf(LPCSTR Buffer, LPCSTR Format, va_list ap)
{
    INT Length = 0;
    LPCSTR Buff = Buffer;
    LPCSTR Fmt = Format;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    BOOL Store;
    INT Width;
    INT Prefix;
    INT Type = -1;

    while (*Fmt)
    {
        if (!*Buff && Length == 0)
        {
            Length = EOF;
            break;
        }
        /* remove any number of blanks */
        else if (isspace((unsigned char) *Fmt))
        {
            while (isspace((unsigned char) *Buff))
            {
                ++Buff;
            }
            ++Fmt;
        }
        else if (*Fmt == '%' &&
                 Internal_ScanfExtractFormatA(&Fmt, TempBuff, sizeof(TempBuff), &Store,
                                              &Width, &Prefix, &Type))
        {
            if (Prefix == SCANF_PREFIX_LONG &&
                (Type == SCANF_TYPE_STRING || Type == SCANF_TYPE_CHAR))
            {
                int len = 0;
                int res;
                WCHAR *charPtr = 0;

                /* a single character */
                if (Type == SCANF_TYPE_CHAR && Width == -1)
                {
                    len = Width = 1;
                }

                /* calculate length of string to copy */
                while (Buff[len] && !isspace((unsigned char) Buff[len]))
                {
                    if (Width != -1 && len >= Width)
                    {
                        break;
                    }
                    ++len;
                }

                if (Store)
                {
                    charPtr = va_arg(ap, WCHAR *);

                    res = MultiByteToWideChar(CP_ACP, 0, Buff, len,
                                            charPtr, len);
                    if (!res)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                            GetLastError());
                        return -1;
                    }
                    if (Type == SCANF_TYPE_STRING)
                    {
                        /* end string */
                        charPtr[res] = 0;
                    }
                    ++Length;
                }
                Buff += len;
            }
            /* this places the number of bytes stored into the next arg */
            else if (Type == SCANF_TYPE_N)
            {
                if (Prefix == SCANF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = Buff - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = Buff - Buffer;
                }
            }
            /* types that sscanf can handle */
            else
            {
                int ret;
                int n;
                LPVOID voidPtr = NULL;

                if (Store)
                {
                    // sscanf_s requires that if we are trying to read "%s" or "%c" or "%[", then
                    // the size of the buffer must follow the buffer we are trying to read into.
                    voidPtr = va_arg(ap, LPVOID);
                    unsigned typeLen = 0;
                    if ((Type == SCANF_TYPE_STRING) || (Type == SCANF_TYPE_BRACKETS))
                    {
                        // Since this is not a Safe CRT API we don't really know the size of the destination
                        // buffer provided by the caller. So we have to assume that the caller has allocated
                        // enough space to hold either the width specified in the format or the entire input
                        // string plus '\0'.
                        typeLen = ((Width > 0) ? Width : strlen(Buffer)) + 1;
                    }
                    else if (Type == SCANF_TYPE_CHAR)
                    {
                        // Check whether the format string contains number of characters
                        // that should be read from the input string.
                        // Note: '\0' does not get appended in the "%c" case.
                        typeLen = (Width > 0) ? Width : 1;
                    }

                    if (typeLen > 0)
                    {
                        ret = sscanf_s(Buff, TempBuff, voidPtr, typeLen, &n);
                    }
                    else
                    {
                        ret = sscanf_s(Buff, TempBuff, voidPtr, &n);
                    }
                }
                else
                {
                    ret = sscanf_s(Buff, TempBuff, &n);
                }

#if SSCANF_CANNOT_HANDLE_MISSING_EXPONENT
                if ((ret == 0) && (Type == SCANF_TYPE_FLOAT))
                {
                    ret = SscanfFloatCheckExponent(Buff, TempBuff, voidPtr, &n);
                }
#endif // SSCANF_CANNOT_HANDLE_MISSING_EXPONENT

                if (ret > 0)
                {
                    Length += ret;
                }
                else
                {
                    /* no match, break scan */
                    break;
                }
                Buff += n;
            }
        }
        else
        {
            /* grab, but not store */
            if (*Fmt == *Buff && Type != SCANF_TYPE_SPACE)
            {
                ++Fmt;
                ++Buff;
            }
            /* doesn't match, break scan */
            else
            {
                break;
            }
        }
    }

    return Length;
}